

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall
dtc::fdt::device_tree::parse_file
          (device_tree *this,text_input_buffer *input,
          vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
          *roots,bool *read_header)

{
  byte bVar1;
  vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_> *pvVar2
  ;
  bool bVar3;
  __type _Var4;
  element_type *peVar5;
  byte local_229;
  string local_218 [32];
  undefined1 local_1f8 [32];
  _Prime_rehash_policy local_1d8;
  __node_base_ptr local_1c8;
  undefined1 local_1c0 [16];
  string local_1b0;
  string local_190;
  byte local_169;
  undefined1 local_168 [7];
  bool name_is_path_reference;
  string name;
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_108;
  FILE *local_f8;
  string local_f0 [32];
  undefined1 local_d0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string ref;
  anon_class_16_2_f1cc56cb expect;
  undefined1 local_58 [8];
  node_ptr n;
  unsigned_long_long local_38;
  unsigned_long_long len;
  unsigned_long_long start;
  bool *read_header_local;
  vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
  *roots_local;
  text_input_buffer *input_local;
  device_tree *this_local;
  
  start = (unsigned_long_long)read_header;
  read_header_local = (bool *)roots;
  roots_local = (vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                 *)input;
  input_local = (text_input_buffer *)this;
  text_input_buffer::next_token(input);
  while (bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,"/dts-v1/;"), bVar3) {
    *(undefined1 *)start = 1;
    text_input_buffer::next_token((text_input_buffer *)roots_local);
  }
  bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,"/plugin/;");
  if (bVar3) {
    this->is_plugin = true;
  }
  text_input_buffer::next_token((text_input_buffer *)roots_local);
  if ((*(byte *)start & 1) == 0) {
    text_input_buffer::parse_error
              ((text_input_buffer *)roots_local,"Expected /dts-v1/; version string");
  }
  do {
    bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,"/memreserve/");
    if (!bVar3) {
      while( true ) {
        local_229 = 0;
        if ((this->valid & 1U) != 0) {
          bVar3 = text_input_buffer::finished((text_input_buffer *)roots_local);
          local_229 = bVar3 ^ 0xff;
        }
        if ((local_229 & 1) == 0) break;
        std::shared_ptr<dtc::fdt::node>::shared_ptr((shared_ptr<dtc::fdt::node> *)local_58);
        bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,"/delete-node/");
        if (bVar3) {
          text_input_buffer::next_token((text_input_buffer *)roots_local);
          ref.field_2._8_8_ = roots_local;
          bVar3 = parse_file(dtc::text_input_buffer&,std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>&,bool&)
                  ::$_0::operator()((void *)((long)&ref.field_2 + 8),'&',
                                    "Expected reference after top-level /delete-node/.");
          if (bVar3) {
            text_input_buffer::parse_node_name_abi_cxx11_
                      ((string *)local_98,(text_input_buffer *)roots_local);
            std::__cxx11::string::string((string *)(local_d0 + 0x18));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_d0 + 0x18));
            std::__cxx11::string::~string((string *)(local_d0 + 0x18));
            if (_Var4) {
              text_input_buffer::parse_error
                        ((text_input_buffer *)roots_local,
                         "Expected label name for top-level /delete-node/.");
              this->valid = false;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->deletions,(value_type *)local_98);
            }
            parse_file(dtc::text_input_buffer&,std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>&,bool&)
            ::$_0::operator()((void *)((long)&ref.field_2 + 8),';',"Missing semicolon.");
            std::__cxx11::string::~string((string *)local_98);
          }
          local_d0._20_4_ = 6;
        }
        else {
          bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,'/');
          if (bVar3) {
            text_input_buffer::next_token((text_input_buffer *)roots_local);
            pvVar2 = roots_local;
            std::__cxx11::string::string(local_f0);
            local_108._M_allocated_capacity = 0;
            local_108._8_8_ = 0;
            local_128._16_8_ = 0;
            local_128._24_8_ = 0;
            local_128._0_8_ = (pointer)0x0;
            local_128._8_8_ = (pointer)0x0;
            local_f8 = (FILE *)0x0;
            std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128);
            std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
            node::parse((text_input_buffer *)local_d0,(device_tree *)pvVar2,(string *)this,
                        (string_set *)local_f0,(string *)local_128,
                        (define_map *)(name.field_2._M_local_buf + 8));
            std::shared_ptr<dtc::fdt::node>::operator=
                      ((shared_ptr<dtc::fdt::node> *)local_58,(shared_ptr<dtc::fdt::node> *)local_d0
                      );
            std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_d0);
            std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
            std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_128);
            std::__cxx11::string::~string(local_f0);
          }
          else {
            bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,'&');
            if (bVar3) {
              text_input_buffer::next_token((text_input_buffer *)roots_local);
              std::__cxx11::string::string((string *)local_168);
              local_169 = 0;
              bVar3 = text_input_buffer::consume((text_input_buffer *)roots_local,'{');
              if ((bVar3) && ((this->is_plugin & 1U) != 0)) {
                text_input_buffer::parse_to_abi_cxx11_
                          (&local_190,(text_input_buffer *)roots_local,'}');
                std::__cxx11::string::operator=((string *)local_168,(string *)&local_190);
                std::__cxx11::string::~string((string *)&local_190);
                text_input_buffer::consume((text_input_buffer *)roots_local,'}');
                local_169 = 1;
              }
              else {
                text_input_buffer::parse_node_name_abi_cxx11_
                          ((string *)(local_1c0 + 0x10),(text_input_buffer *)roots_local);
                std::__cxx11::string::operator=((string *)local_168,(string *)(local_1c0 + 0x10));
                std::__cxx11::string::~string((string *)(local_1c0 + 0x10));
              }
              text_input_buffer::next_token((text_input_buffer *)roots_local);
              pvVar2 = roots_local;
              local_1d8._M_max_load_factor = 0.0;
              local_1d8._4_4_ = 0;
              local_1d8._M_next_resize = 0;
              local_1f8._16_8_ = 0;
              local_1f8._24_8_ = 0;
              local_1f8._0_8_ = (__buckets_ptr)0x0;
              local_1f8._8_8_ = 0;
              local_1c8 = (__node_base_ptr)0x0;
              std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1f8);
              std::__cxx11::string::string(local_218);
              node::parse((text_input_buffer *)local_1c0,(device_tree *)pvVar2,(string *)this,
                          (string_set *)local_168,(string *)local_1f8,(define_map *)local_218);
              std::shared_ptr<dtc::fdt::node>::operator=
                        ((shared_ptr<dtc::fdt::node> *)local_58,
                         (shared_ptr<dtc::fdt::node> *)local_1c0);
              std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_1c0);
              std::__cxx11::string::~string(local_218);
              std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1f8);
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
              bVar1 = local_169;
              if (bVar3) {
                peVar5 = std::
                         __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_58);
                peVar5->name_is_path_reference = (bool)(bVar1 & 1);
              }
              std::__cxx11::string::~string((string *)local_168);
            }
            else {
              text_input_buffer::parse_error
                        ((text_input_buffer *)roots_local,"Failed to find root node /.");
            }
          }
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
          if (bVar3) {
            std::
            vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
            ::push_back((vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                         *)read_header_local,(value_type *)local_58);
          }
          else {
            this->valid = false;
          }
          text_input_buffer::next_token((text_input_buffer *)roots_local);
          local_d0._20_4_ = 0;
        }
        std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_58);
      }
      return;
    }
    text_input_buffer::next_token((text_input_buffer *)roots_local);
    bVar3 = text_input_buffer::consume_integer_expression((text_input_buffer *)roots_local,&len);
    if (bVar3) {
      text_input_buffer::next_token((text_input_buffer *)roots_local);
      bVar3 = text_input_buffer::consume_integer_expression
                        ((text_input_buffer *)roots_local,&local_38);
      if (!bVar3) goto LAB_001870de;
      std::pair<unsigned_long,_unsigned_long>::
      pair<unsigned_long_long_&,_unsigned_long_long_&,_true>
                ((pair<unsigned_long,_unsigned_long> *)
                 &n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&len,
                 &local_38);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(&this->reservations,
                  (value_type *)
                  &n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
LAB_001870de:
      text_input_buffer::parse_error
                ((text_input_buffer *)roots_local,"Expected size on /memreserve/ node.");
    }
    text_input_buffer::next_token((text_input_buffer *)roots_local);
    text_input_buffer::consume((text_input_buffer *)roots_local,';');
    text_input_buffer::next_token((text_input_buffer *)roots_local);
  } while( true );
}

Assistant:

void
device_tree::parse_file(text_input_buffer &input,
                        std::vector<node_ptr> &roots,
                        bool &read_header)
{
	input.next_token();
	// Read the header
	while (input.consume("/dts-v1/;"))
	{
		read_header = true;
		input.next_token();
	}
	if (input.consume("/plugin/;"))
	{
		is_plugin = true;
	}
	input.next_token();
	if (!read_header)
	{
		input.parse_error("Expected /dts-v1/; version string");
	}
	// Read any memory reservations
	while (input.consume("/memreserve/"))
	{
		unsigned long long start, len;
		input.next_token();
		// Read the start and length.
		if (!(input.consume_integer_expression(start) &&
		    (input.next_token(),
		    input.consume_integer_expression(len))))
		{
			input.parse_error("Expected size on /memreserve/ node.");
		}
		else
		{
			reservations.push_back(reservation(start, len));
		}
		input.next_token();
		input.consume(';');
		input.next_token();
	}
	while (valid && !input.finished())
	{
		node_ptr n;
		if (input.consume("/delete-node/"))
		{
			// Top-level /delete-node/ directives refer to references that must
			// be deleted later.
			input.next_token();
			auto expect = [&](auto token, const char *msg)
			{
				if (!input.consume(token))
				{
					input.parse_error(msg);
					valid = false;
				}
				input.next_token();
				return valid;
			};
			if (expect('&', "Expected reference after top-level /delete-node/."))
			{
				string ref = input.parse_node_name();
				if (ref == string())
				{
					input.parse_error("Expected label name for top-level /delete-node/.");
					valid = false;
				}
				else
				{
					deletions.push_back(std::move(ref));
				}
				expect(';', "Missing semicolon.");
			}
			continue;
		}
		else if (input.consume('/'))
		{
			input.next_token();
			n = node::parse(input, *this, string(), string_set(), string(), &defines);
		}
		else if (input.consume('&'))
		{
			input.next_token();
			string name;
			bool name_is_path_reference = false;
			// This is to deal with names intended as path references, e.g. &{/path}.
			// While it may make sense in a non-plugin context, we don't support such
			// usage at this time.
			if (input.consume('{') && is_plugin)
			{
				name = input.parse_to('}');
				input.consume('}');
				name_is_path_reference = true;
			}
			else
			{
				name = input.parse_node_name();
			}
			input.next_token();
			n = node::parse(input, *this, std::move(name), string_set(), string(), &defines);
			if (n)
			{
				n->name_is_path_reference = name_is_path_reference;
			}
		}
		else
		{
			input.parse_error("Failed to find root node /.");
		}
		if (n)
		{
			roots.push_back(std::move(n));
		}
		else
		{
			valid = false;
		}
		input.next_token();
	}
}